

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v6::internal::
     handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>>
               (char spec,
               int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *handler)

{
  char in_DIL;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *unaff_retaddr;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_00000080;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_000000b0;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_00000140;
  
  if (in_DIL == '\0') {
LAB_00207337:
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::
    int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec(in_stack_000000b0);
    return;
  }
  if (in_DIL == 'B') {
LAB_0020734f:
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::
    int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin(in_stack_000000b0);
  }
  else {
    if (in_DIL == 'L') {
LAB_00207367:
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
                (in_stack_00000140);
      return;
    }
    if (in_DIL != 'X') {
      if (in_DIL == 'b') goto LAB_0020734f;
      if (in_DIL == 'd') goto LAB_00207337;
      if (in_DIL == 'n') goto LAB_00207367;
      if (in_DIL == 'o') {
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
                  (in_stack_000000b0);
        return;
      }
      if (in_DIL != 'x') {
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_error
                  (unaff_retaddr);
      }
    }
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::
    int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex(in_stack_00000080);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
  case 'L':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}